

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

string * sensors_analytics::HttpSender::Base64Encode(string *__return_storage_ptr__,string *data)

{
  undefined6 uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong in_RAX;
  byte bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  long lVar13;
  pointer pcVar14;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  undefined8 local_38;
  ulong uVar12;
  
  pcVar14 = (data->_M_dataplus)._M_p;
  sVar8 = data->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (sVar8 != 0) {
    uVar9 = 0;
    local_38 = in_RAX;
    do {
      uVar2 = local_38;
      uVar11 = (int)uVar9 + 1;
      uVar12 = (ulong)uVar11;
      *(char *)((long)&local_38 + uVar9 + 1) = *pcVar14;
      cVar10 = (char)__return_storage_ptr__;
      if (uVar11 == 3) {
        bVar3 = local_38._1_1_;
        bVar4 = local_38._2_1_;
        bVar5 = local_38._1_1_ >> 2;
        local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
        local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
        uVar1 = (undefined6)local_38;
        local_38._3_1_ = SUB81(uVar2,3);
        bVar3 = local_38._3_1_;
        local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
        local_38 = CONCAT17(bVar3,(undefined7)local_38) & 0x3fffffffffffffff;
        lVar13 = 0;
        do {
          std::__cxx11::string::push_back(cVar10);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        uVar12 = 0;
      }
      sVar8 = sVar8 - 1;
      pcVar14 = pcVar14 + 1;
      uVar9 = uVar12;
    } while (sVar8 != 0);
    iVar7 = (int)uVar12;
    if (iVar7 != 0) {
      if (iVar7 < 3) {
        memset((void *)((long)&local_38 + uVar12 + 1),0,(ulong)(2 - iVar7) + 1);
      }
      uVar9 = local_38;
      bVar3 = local_38._1_1_;
      bVar4 = local_38._2_1_;
      bVar5 = local_38._1_1_ >> 2;
      local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
      local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
      uVar1 = (undefined6)local_38;
      local_38._3_1_ = SUB81(uVar9,3);
      bVar3 = local_38._3_1_;
      local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
      local_38 = CONCAT17(bVar3,(undefined7)local_38) & 0x3fffffffffffffff;
      if (-1 < iVar7) {
        uVar9 = 0;
        do {
          std::__cxx11::string::push_back(cVar10);
          uVar9 = uVar9 + 1;
        } while (iVar7 + 1 != uVar9);
      }
      iVar6 = 3;
      if (3 < iVar7) {
        iVar6 = iVar7;
      }
      iVar7 = (iVar6 - iVar7) + 1;
      while (iVar7 = iVar7 + -1, iVar7 != 0) {
        std::__cxx11::string::push_back(cVar10);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpSender::Base64Encode(const string &data) {
  const unsigned char
      *bytes_to_encode = reinterpret_cast<const unsigned char *>(data.data());
  size_t in_len = data.length();
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len-- > 0) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++)
        ret += kBase64Chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i != 0) {
    for (j = i; j < 3; j++)
      char_array_3[j] = '\0';
    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;
    for (j = 0; (j < i + 1); j++)
      ret += kBase64Chars[char_array_4[j]];
    while ((i++ < 3))
      ret += '=';
  }
  return ret;
}